

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::AddDefaultGenerators(cmake *this)

{
  cmGlobalGeneratorFactory *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_cmGlobalGeneratorFactory_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  cmGlobalGhsMultiGenerator::NewFactory();
  std::
  vector<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>,std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>>
  ::
  emplace_back<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>
            ((vector<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>,std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>>
              *)this,(unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                      *)&local_18);
  if (local_18._M_head_impl != (cmGlobalGeneratorFactory *)0x0) {
    (*(local_18._M_head_impl)->_vptr_cmGlobalGeneratorFactory[1])();
  }
  cmGlobalUnixMakefileGenerator3::NewFactory();
  std::
  vector<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>,std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>>
  ::
  emplace_back<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>
            ((vector<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>,std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>>
              *)this,(unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                      *)&local_18);
  if (local_18._M_head_impl != (cmGlobalGeneratorFactory *)0x0) {
    (*(local_18._M_head_impl)->_vptr_cmGlobalGeneratorFactory[1])();
  }
  cmGlobalNinjaGenerator::NewFactory();
  std::
  vector<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>,std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>>
  ::
  emplace_back<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>
            ((vector<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>,std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>>
              *)this,(unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                      *)&local_18);
  if (local_18._M_head_impl != (cmGlobalGeneratorFactory *)0x0) {
    (*(local_18._M_head_impl)->_vptr_cmGlobalGeneratorFactory[1])();
  }
  cmGlobalNinjaMultiGenerator::NewFactory();
  std::
  vector<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>,std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>>
  ::
  emplace_back<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>
            ((vector<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>,std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>>
              *)this,(unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                      *)&local_18);
  if (local_18._M_head_impl != (cmGlobalGeneratorFactory *)0x0) {
    (*(local_18._M_head_impl)->_vptr_cmGlobalGeneratorFactory[1])();
  }
  cmGlobalWatcomWMakeGenerator::NewFactory();
  std::
  vector<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>,std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>>
  ::
  emplace_back<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>
            ((vector<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>,std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,std::default_delete<cmGlobalGeneratorFactory>>>>
              *)this,(unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                      *)&local_18);
  if (local_18._M_head_impl != (cmGlobalGeneratorFactory *)0x0) {
    (*(local_18._M_head_impl)->_vptr_cmGlobalGeneratorFactory[1])();
  }
  return;
}

Assistant:

void cmake::AddDefaultGenerators()
{
#if defined(_WIN32) && !defined(__CYGWIN__)
#  if !defined(CMAKE_BOOT_MINGW)
  this->Generators.push_back(
    cmGlobalVisualStudioVersionedGenerator::NewFactory17());
  this->Generators.push_back(
    cmGlobalVisualStudioVersionedGenerator::NewFactory16());
  this->Generators.push_back(
    cmGlobalVisualStudioVersionedGenerator::NewFactory15());
  this->Generators.push_back(cmGlobalVisualStudio14Generator::NewFactory());
  this->Generators.push_back(cmGlobalVisualStudio12Generator::NewFactory());
  this->Generators.push_back(cmGlobalVisualStudio11Generator::NewFactory());
  this->Generators.push_back(cmGlobalVisualStudio9Generator::NewFactory());
  this->Generators.push_back(cmGlobalBorlandMakefileGenerator::NewFactory());
  this->Generators.push_back(cmGlobalNMakeMakefileGenerator::NewFactory());
  this->Generators.push_back(cmGlobalJOMMakefileGenerator::NewFactory());
#  endif
  this->Generators.push_back(cmGlobalMSYSMakefileGenerator::NewFactory());
  this->Generators.push_back(cmGlobalMinGWMakefileGenerator::NewFactory());
#endif
#if !defined(CMAKE_BOOTSTRAP)
#  if (defined(__linux__) && !defined(__ANDROID__)) || defined(_WIN32)
  this->Generators.push_back(cmGlobalGhsMultiGenerator::NewFactory());
#  endif
  this->Generators.push_back(cmGlobalUnixMakefileGenerator3::NewFactory());
  this->Generators.push_back(cmGlobalNinjaGenerator::NewFactory());
  this->Generators.push_back(cmGlobalNinjaMultiGenerator::NewFactory());
#elif defined(CMAKE_BOOTSTRAP_NINJA)
  this->Generators.push_back(cmGlobalNinjaGenerator::NewFactory());
#elif defined(CMAKE_BOOTSTRAP_MAKEFILES)
  this->Generators.push_back(cmGlobalUnixMakefileGenerator3::NewFactory());
#endif
#if defined(CMAKE_USE_WMAKE)
  this->Generators.push_back(cmGlobalWatcomWMakeGenerator::NewFactory());
#endif
#ifdef CMAKE_USE_XCODE
  this->Generators.push_back(cmGlobalXCodeGenerator::NewFactory());
#endif
}